

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FExecList::AddPullins(FExecList *this,TArray<FString,_FString> *wads)

{
  uint uVar1;
  FString *this_00;
  char *file;
  uint local_1c;
  uint i;
  TArray<FString,_FString> *wads_local;
  FExecList *this_local;
  
  local_1c = 0;
  while( true ) {
    uVar1 = TArray<FString,_FString>::Size(&this->Pullins);
    if (uVar1 <= local_1c) break;
    this_00 = TArray<FString,_FString>::operator[](&this->Pullins,(ulong)local_1c);
    file = FString::operator_cast_to_char_(this_00);
    D_AddFile(wads,file,true,-1);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void FExecList::AddPullins(TArray<FString> &wads) const
{
	for (unsigned i = 0; i < Pullins.Size(); ++i)
	{
		D_AddFile(wads, Pullins[i]);
	}
}